

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encrypt.c
# Opt level: O0

_Bool COSE_Enveloped_AddRecipient(HCOSE_ENVELOPED hEnc,HCOSE_RECIPIENT hRecip,cose_errback *perr)

{
  _Bool _Var1;
  cose_error cVar2;
  cn_cbor_errback local_48;
  cn_cbor_errback cbor_error;
  cn_cbor *pRecipients;
  COSE_Enveloped *pEncrypt;
  COSE_RecipientInfo *pRecip;
  cose_errback *perr_local;
  HCOSE_RECIPIENT hRecip_local;
  HCOSE_ENVELOPED hEnc_local;
  
  cbor_error.pos = 0;
  cbor_error.err = CN_CBOR_NO_ERROR;
  _Var1 = IsValidEnvelopedHandle(hEnc);
  if (_Var1) {
    _Var1 = IsValidRecipientHandle(hRecip);
    if (_Var1) {
      *(undefined8 *)(hRecip + 0x70) = *(undefined8 *)(hEnc + 0x68);
      *(HCOSE_RECIPIENT *)(hEnc + 0x68) = hRecip;
      cbor_error = (cn_cbor_errback)_COSE_arrayget_int((COSE *)hEnc,3);
      if (cbor_error == (cn_cbor_errback)0x0) {
        cbor_error = (cn_cbor_errback)cn_cbor_array_create(&local_48);
        if (cbor_error == (cn_cbor_errback)0x0) {
          if (perr == (cose_errback *)0x0) {
            return false;
          }
          cVar2 = _MapFromCBOR(local_48);
          perr->err = cVar2;
          return false;
        }
        _Var1 = _COSE_array_replace((COSE *)hEnc,(cn_cbor *)cbor_error,3,&local_48);
        if (!_Var1) {
          cn_cbor_free((cn_cbor *)cbor_error);
          if (perr == (cose_errback *)0x0) {
            return false;
          }
          cVar2 = _MapFromCBOR(local_48);
          perr->err = cVar2;
          return false;
        }
      }
      _Var1 = cn_cbor_array_append((cn_cbor *)cbor_error,*(cn_cbor **)(hRecip + 0x18),&local_48);
      if (_Var1) {
        *(int *)(hRecip + 0x10) = *(int *)(hRecip + 0x10) + 1;
        return true;
      }
      if (perr != (cose_errback *)0x0) {
        cVar2 = _MapFromCBOR(local_48);
        perr->err = cVar2;
      }
    }
    else if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_HANDLE;
    }
  }
  else if (perr != (cose_errback *)0x0) {
    perr->err = COSE_ERR_INVALID_HANDLE;
  }
  return false;
}

Assistant:

bool COSE_Enveloped_AddRecipient(HCOSE_ENVELOPED hEnc, HCOSE_RECIPIENT hRecip, cose_errback * perr)
{
	COSE_RecipientInfo * pRecip;
	COSE_Enveloped * pEncrypt;
	cn_cbor * pRecipients  = NULL;
#ifdef USE_CBOR_CONTEXT
	cn_cbor_context * context;
#endif
	cn_cbor_errback cbor_error;

	CHECK_CONDITION(IsValidEnvelopedHandle(hEnc), COSE_ERR_INVALID_HANDLE);
	CHECK_CONDITION(IsValidRecipientHandle(hRecip), COSE_ERR_INVALID_HANDLE);

	pEncrypt = (COSE_Enveloped *)hEnc;
	pRecip = (COSE_RecipientInfo *)hRecip;

#ifdef USE_CBOR_CONTEXT
	context = &pEncrypt->m_message.m_allocContext;
#endif // USE_CBOR_CONTEXT

	pRecip->m_recipientNext = pEncrypt->m_recipientFirst;
	pEncrypt->m_recipientFirst = pRecip;

	pRecipients = _COSE_arrayget_int(&pEncrypt->m_message, INDEX_RECIPIENTS);
	if (pRecipients == NULL) {
		pRecipients = cn_cbor_array_create(CBOR_CONTEXT_PARAM_COMMA &cbor_error);
		CHECK_CONDITION_CBOR(pRecipients != NULL, cbor_error);

		if (!_COSE_array_replace(&pEncrypt->m_message, pRecipients, INDEX_RECIPIENTS, CBOR_CONTEXT_PARAM_COMMA &cbor_error)) {
			CN_CBOR_FREE(pRecipients, context);
			if (perr != NULL) perr->err = _MapFromCBOR(cbor_error);
			goto errorReturn;
		}
	}

	CHECK_CONDITION_CBOR(cn_cbor_array_append(pRecipients, pRecip->m_encrypt.m_message.m_cbor, &cbor_error), cbor_error);

	pRecip->m_encrypt.m_message.m_refCount++;

	return true;

errorReturn:
	return false;
}